

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O3

void nite::addRenderList(Renderable *object)

{
  Batch *this;
  long lVar1;
  
  this = currentBatch;
  if (currentBatch != (Batch *)0x0) {
    object->target = 0xb;
    Batch::add(this,object);
    return;
  }
  lVar1 = (long)::target;
  object->target = ::target;
  RenderTarget::add(targets + lVar1,object);
  return;
}

Assistant:

void nite::addRenderList(Renderable *object){
	if(currentBatch != NULL){
		object->target = nite::RenderTargetDummy;
		currentBatch->add(object);
		return;
	}
	object->target = target;
	targets[target].add(object);
}